

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O0

bool libcellml::equalEntities
               (EntityPtr *owner,
               vector<std::shared_ptr<libcellml::Entity>,_std::allocator<std::shared_ptr<libcellml::Entity>_>_>
               *entities)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  pointer this;
  bool bVar2;
  bool bVar3;
  size_type sVar4;
  iterator __first;
  iterator __last;
  __shared_ptr_access<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *index_00;
  element_type *this_01;
  element_type *this_02;
  element_type *peVar5;
  Entity *this_03;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_158;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_150;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_148;
  const_iterator local_140;
  shared_ptr<libcellml::Entity> local_138;
  ResetPtr resetOther;
  shared_ptr<libcellml::Reset> reset;
  undefined1 local_f8 [8];
  VariablePtr variableOther;
  shared_ptr<libcellml::Variable> variable;
  shared_ptr<libcellml::Component> component;
  undefined1 local_b8 [8];
  UnitsPtr unitsOther;
  shared_ptr<libcellml::Model> model;
  size_t currentIndex;
  size_t index;
  bool entityFound;
  shared_ptr<libcellml::Entity> *entity;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::shared_ptr<libcellml::Entity>,_std::allocator<std::shared_ptr<libcellml::Entity>_>_>
  *__range1;
  allocator<unsigned_long> local_39;
  undefined1 local_38 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> unmatchedIndex;
  vector<std::shared_ptr<libcellml::Entity>,_std::allocator<std::shared_ptr<libcellml::Entity>_>_>
  *entities_local;
  EntityPtr *owner_local;
  
  unmatchedIndex.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)entities;
  sVar4 = std::
          vector<std::shared_ptr<libcellml::Entity>,_std::allocator<std::shared_ptr<libcellml::Entity>_>_>
          ::size(entities);
  std::allocator<unsigned_long>::allocator(&local_39);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_38,sVar4,&local_39);
  std::allocator<unsigned_long>::~allocator(&local_39);
  __first = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_38);
  __last = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_38);
  std::
  iota<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,int>
            ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )__first._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )__last._M_current,0);
  this = unmatchedIndex.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
  __end1 = std::
           vector<std::shared_ptr<libcellml::Entity>,_std::allocator<std::shared_ptr<libcellml::Entity>_>_>
           ::begin((vector<std::shared_ptr<libcellml::Entity>,_std::allocator<std::shared_ptr<libcellml::Entity>_>_>
                    *)unmatchedIndex.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  entity = (shared_ptr<libcellml::Entity> *)
           std::
           vector<std::shared_ptr<libcellml::Entity>,_std::allocator<std::shared_ptr<libcellml::Entity>_>_>
           ::end((vector<std::shared_ptr<libcellml::Entity>,_std::allocator<std::shared_ptr<libcellml::Entity>_>_>
                  *)this);
  do {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_std::shared_ptr<libcellml::Entity>_*,_std::vector<std::shared_ptr<libcellml::Entity>,_std::allocator<std::shared_ptr<libcellml::Entity>_>_>_>
                                *)&entity);
    if (!bVar2) {
      owner_local._7_1_ = true;
LAB_003646bd:
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_38);
      return owner_local._7_1_;
    }
    this_00 = (__shared_ptr_access<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              __gnu_cxx::
              __normal_iterator<const_std::shared_ptr<libcellml::Entity>_*,_std::vector<std::shared_ptr<libcellml::Entity>,_std::allocator<std::shared_ptr<libcellml::Entity>_>_>_>
              ::operator*(&__end1);
    bVar2 = false;
    currentIndex = 0;
    while( true ) {
      sVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_38);
      bVar3 = false;
      if (currentIndex < sVar4) {
        bVar3 = (bool)(bVar2 ^ 1);
      }
      if (!bVar3) break;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_38,currentIndex);
      std::dynamic_pointer_cast<libcellml::Model,libcellml::Entity>
                ((shared_ptr<libcellml::Entity> *)
                 &unitsOther.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      bVar3 = std::operator!=((shared_ptr<libcellml::Model> *)
                              &unitsOther.
                               super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount,(nullptr_t)0x0);
      if (bVar3) {
        index_00 = std::
                   __shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&unitsOther.
                                  super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount);
        Model::units((Model *)local_b8,(size_t)index_00);
        this_01 = std::
                  __shared_ptr_access<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->(this_00);
        p_Var1 = &component.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount;
        std::shared_ptr<libcellml::Entity>::shared_ptr<libcellml::Units,void>
                  ((shared_ptr<libcellml::Entity> *)p_Var1,(shared_ptr<libcellml::Units> *)local_b8)
        ;
        bVar3 = Entity::equals(this_01,(EntityPtr *)p_Var1);
        std::shared_ptr<libcellml::Entity>::~shared_ptr
                  ((shared_ptr<libcellml::Entity> *)
                   &component.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        if (bVar3) {
          bVar2 = true;
        }
        std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)local_b8);
      }
      else {
        std::dynamic_pointer_cast<libcellml::Component,libcellml::Entity>
                  ((shared_ptr<libcellml::Entity> *)
                   &variable.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::dynamic_pointer_cast<libcellml::Variable,libcellml::Entity>
                  ((shared_ptr<libcellml::Entity> *)
                   &variableOther.
                    super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
        ;
        bVar3 = std::operator!=((shared_ptr<libcellml::Variable> *)
                                &variableOther.
                                 super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount,(nullptr_t)0x0);
        if (bVar3) {
          peVar5 = std::
                   __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&variable.
                                    super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount);
          Component::variable((Component *)local_f8,(size_t)peVar5);
          this_02 = std::
                    __shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)&variableOther.
                                     super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount);
          p_Var1 = &reset.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount;
          std::shared_ptr<libcellml::Entity>::shared_ptr<libcellml::Variable,void>
                    ((shared_ptr<libcellml::Entity> *)p_Var1,
                     (shared_ptr<libcellml::Variable> *)local_f8);
          bVar3 = Entity::equals((Entity *)this_02,(EntityPtr *)p_Var1);
          std::shared_ptr<libcellml::Entity>::~shared_ptr
                    ((shared_ptr<libcellml::Entity> *)
                     &reset.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          if (bVar3) {
            bVar2 = true;
          }
          std::shared_ptr<libcellml::Variable>::~shared_ptr
                    ((shared_ptr<libcellml::Variable> *)local_f8);
        }
        else {
          std::dynamic_pointer_cast<libcellml::Reset,libcellml::Entity>
                    ((shared_ptr<libcellml::Entity> *)
                     &resetOther.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          peVar5 = std::
                   __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&variable.
                                    super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount);
          Component::reset((Component *)&stack0xfffffffffffffed8,(size_t)peVar5);
          this_03 = (Entity *)
                    std::
                    __shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)&resetOther.
                                     super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount);
          std::shared_ptr<libcellml::Entity>::shared_ptr<libcellml::Reset,void>
                    (&local_138,(shared_ptr<libcellml::Reset> *)&stack0xfffffffffffffed8);
          bVar3 = Entity::equals(this_03,&local_138);
          std::shared_ptr<libcellml::Entity>::~shared_ptr(&local_138);
          if (bVar3) {
            bVar2 = true;
          }
          std::shared_ptr<libcellml::Reset>::~shared_ptr
                    ((shared_ptr<libcellml::Reset> *)&stack0xfffffffffffffed8);
          std::shared_ptr<libcellml::Reset>::~shared_ptr
                    ((shared_ptr<libcellml::Reset> *)
                     &resetOther.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
        }
        std::shared_ptr<libcellml::Variable>::~shared_ptr
                  ((shared_ptr<libcellml::Variable> *)
                   &variableOther.
                    super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
        ;
        std::shared_ptr<libcellml::Component>::~shared_ptr
                  ((shared_ptr<libcellml::Component> *)
                   &variable.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
      }
      std::shared_ptr<libcellml::Model>::~shared_ptr
                ((shared_ptr<libcellml::Model> *)
                 &unitsOther.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      currentIndex = currentIndex + 1;
    }
    if (!bVar2) {
      owner_local._7_1_ = false;
      goto LAB_003646bd;
    }
    local_158._M_current =
         (unsigned_long *)
         std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                   ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_38);
    local_150 = __gnu_cxx::
                __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                ::operator+(&local_158,currentIndex);
    local_148 = __gnu_cxx::
                __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                ::operator-(&local_150,1);
    __gnu_cxx::
    __normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>
    ::__normal_iterator<unsigned_long*>
              ((__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>
                *)&local_140,&local_148);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::erase
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_38,local_140);
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<libcellml::Entity>_*,_std::vector<std::shared_ptr<libcellml::Entity>,_std::allocator<std::shared_ptr<libcellml::Entity>_>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

bool equalEntities(const EntityPtr &owner, const std::vector<EntityPtr> &entities)
{
    std::vector<size_t> unmatchedIndex(entities.size());
    std::iota(unmatchedIndex.begin(), unmatchedIndex.end(), 0);
    for (const auto &entity : entities) {
        bool entityFound = false;
        size_t index = 0;
        for (index = 0; index < unmatchedIndex.size() && !entityFound; ++index) {
            size_t currentIndex = unmatchedIndex.at(index);
            auto model = std::dynamic_pointer_cast<Model>(owner);
            if (model != nullptr) {
                auto unitsOther = model->units(currentIndex);
                if (entity->equals(unitsOther)) {
                    entityFound = true;
                }
            } else {
                auto component = std::dynamic_pointer_cast<Component>(owner);
                auto variable = std::dynamic_pointer_cast<Variable>(entity);
                if (variable != nullptr) {
                    auto variableOther = component->variable(currentIndex);
                    if (variable->equals(variableOther)) {
                        entityFound = true;
                    }
                } else {
                    auto reset = std::dynamic_pointer_cast<Reset>(entity);
                    auto resetOther = component->reset(currentIndex);
                    if (reset->equals(resetOther)) {
                        entityFound = true;
                    }
                }
            }
        }
        if (entityFound) {
            // We are going to assume here that nobody is going to add more
            // than 2,147,483,647 units to this component. And much more than
            // that in a 64-bit environment.
            unmatchedIndex.erase(unmatchedIndex.begin() + ptrdiff_t(index) - 1);
        } else {
            return false;
        }
    }
    return true;
}